

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

bool __thiscall VmaDedicatedAllocationList::Validate(VmaDedicatedAllocationList *this)

{
  size_t sVar1;
  VmaRWMutex *in_RDI;
  VmaAllocation alloc;
  VmaMutexLockRead lock;
  size_t actualCount;
  size_t declaredCount;
  ItemType *in_stack_ffffffffffffffa0;
  VmaIntrusiveLinkedList<VmaDedicatedAllocationListItemTraits> *this_00;
  ItemType *local_30;
  size_t local_20;
  
  this_00 = (VmaIntrusiveLinkedList<VmaDedicatedAllocationListItemTraits> *)
            (&in_RDI[1].m_Mutex._M_impl._M_rwlock.__align + 1);
  sVar1 = VmaIntrusiveLinkedList<VmaDedicatedAllocationListItemTraits>::GetCount(this_00);
  local_20 = 0;
  VmaMutexLockRead::VmaMutexLockRead
            ((VmaMutexLockRead *)this_00,in_RDI,SUB81((ulong)in_stack_ffffffffffffffa0 >> 0x38,0));
  local_30 = VmaIntrusiveLinkedList<VmaDedicatedAllocationListItemTraits>::Front(this_00);
  while (local_30 != (ItemType *)0x0) {
    local_20 = local_20 + 1;
    in_stack_ffffffffffffffa0 =
         VmaIntrusiveLinkedList<VmaDedicatedAllocationListItemTraits>::GetNext((ItemType *)0x2eb2d9)
    ;
    local_30 = in_stack_ffffffffffffffa0;
  }
  VmaMutexLockRead::~VmaMutexLockRead((VmaMutexLockRead *)in_stack_ffffffffffffffa0);
  return local_20 == sVar1;
}

Assistant:

bool VmaDedicatedAllocationList::Validate()
{
    const size_t declaredCount = m_AllocationList.GetCount();
    size_t actualCount = 0;
    VmaMutexLockRead lock(m_Mutex, m_UseMutex);
    for (VmaAllocation alloc = m_AllocationList.Front();
        alloc != VMA_NULL; alloc = m_AllocationList.GetNext(alloc))
    {
        ++actualCount;
    }
    VMA_VALIDATE(actualCount == declaredCount);

    return true;
}